

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_v_predictor_8x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  ushort uVar8;
  undefined1 auVar9 [15];
  unkuint9 Var10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [13];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  uint uVar15;
  short sVar16;
  short sVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ushort uVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ushort uVar30;
  ushort uVar34;
  ushort uVar36;
  ushort uVar38;
  ushort uVar40;
  ushort uVar42;
  ushort uVar44;
  undefined1 auVar32 [16];
  ushort uVar31;
  ushort uVar35;
  ushort uVar37;
  ushort uVar39;
  ushort uVar41;
  ushort uVar43;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  undefined1 auVar33 [16];
  undefined1 auVar48 [16];
  
  auVar29 = _DAT_005158a0;
  auVar17 = pshuflw(ZEXT116(left_column[0x1f]),ZEXT116(left_column[0x1f]),0);
  sVar16 = auVar17._0_2_;
  sVar19 = auVar17._2_2_;
  auVar33._2_2_ = sVar19 * 0x10;
  auVar33._0_2_ = sVar16;
  auVar33._4_2_ = sVar16 * 0x1f;
  auVar33._6_2_ = sVar19 * 0x2e;
  auVar33._8_2_ = sVar16 * 0x3c;
  auVar33._10_2_ = sVar19 * 0x4a;
  auVar33._12_2_ = sVar16 * 0x57;
  auVar33._14_2_ = sVar19 * 99;
  auVar17._0_2_ = sVar16 * 0xbe;
  auVar17._2_2_ = sVar19 * 0xc5;
  auVar17._4_2_ = sVar16 * 0xcc;
  auVar17._6_2_ = sVar19 * 0xd3;
  auVar17._8_2_ = sVar16 * 0xd9;
  auVar17._10_2_ = sVar19 * 0xde;
  auVar17._12_2_ = sVar16 * 0xe3;
  auVar17._14_2_ = sVar19 * 0xe7;
  uVar1 = *(ulong *)top_row;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = (char)(uVar1 >> 0x28);
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = (char)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._9_6_ = auVar6._9_6_;
  auVar9._7_8_ = 0;
  auVar9._0_7_ = auVar7._8_7_;
  Var10 = CONCAT81(SUB158(auVar9 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar13._9_6_ = 0;
  auVar13._0_9_ = Var10;
  auVar11._1_10_ = SUB1510(auVar13 << 0x30,5);
  auVar11[0] = (char)(uVar1 >> 0x10);
  auVar14._11_4_ = 0;
  auVar14._0_11_ = auVar11;
  auVar12._1_12_ = SUB1512(auVar14 << 0x20,3);
  auVar12[0] = (char)(uVar1 >> 8);
  uVar20 = (ushort)(byte)uVar1;
  uVar15 = 0xfefdfefe;
  do {
    uVar15 = uVar15 + 0x2020202;
    auVar48._4_4_ = uVar15;
    auVar48._0_4_ = uVar15;
    auVar48._8_4_ = uVar15;
    auVar48._12_4_ = uVar15;
    auVar32 = pshufb(auVar29,auVar48);
    auVar48 = pshufb(auVar33,auVar48);
    sVar21 = auVar12._0_2_;
    sVar22 = auVar11._0_2_;
    sVar23 = (short)Var10;
    sVar24 = auVar7._8_2_;
    sVar25 = auVar5._10_2_;
    sVar26 = auVar3._12_2_;
    uVar8 = auVar2._13_2_ >> 8;
    uVar30 = auVar32._0_2_ * uVar20 + auVar48._0_2_ + 0x80;
    uVar34 = auVar32._2_2_ * sVar21 + auVar48._2_2_ + 0x80;
    uVar36 = auVar32._4_2_ * sVar22 + auVar48._4_2_ + 0x80;
    uVar38 = auVar32._6_2_ * sVar23 + auVar48._6_2_ + 0x80;
    uVar40 = auVar32._8_2_ * sVar24 + auVar48._8_2_ + 0x80;
    uVar42 = auVar32._10_2_ * sVar25 + auVar48._10_2_ + 0x80;
    uVar44 = auVar32._12_2_ * sVar26 + auVar48._12_2_ + 0x80;
    uVar46 = auVar32._14_2_ * uVar8 + auVar48._14_2_ + 0x80;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar37 = uVar36 >> 8;
    uVar39 = uVar38 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47),
                  CONCAT16((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45),
                           CONCAT15((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                                    (0xff < uVar43),
                                    CONCAT14((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8)
                                             - (0xff < uVar41),
                                             CONCAT13((uVar39 != 0) * (uVar39 < 0x100) *
                                                      (char)(uVar38 >> 8) - (0xff < uVar39),
                                                      CONCAT12((uVar37 != 0) * (uVar37 < 0x100) *
                                                               (char)(uVar36 >> 8) - (0xff < uVar37)
                                                               ,CONCAT11((uVar35 != 0) *
                                                                         (uVar35 < 0x100) *
                                                                         (char)(uVar34 >> 8) -
                                                                         (0xff < uVar35),
                                                                         (uVar31 != 0) *
                                                                         (uVar31 < 0x100) *
                                                                         (char)(uVar30 >> 8) -
                                                                         (0xff < uVar31))))))));
    auVar48 = _DAT_005158c0;
    dst = dst + stride;
  } while (uVar15 < 0xd0c0d0d);
  auVar29._0_2_ = sVar16 * 0x6f;
  auVar29._2_2_ = sVar19 * 0x7b;
  auVar29._4_2_ = sVar16 * 0x86;
  auVar29._6_2_ = sVar19 * 0x91;
  auVar29._8_2_ = sVar16 * 0x9b;
  auVar29._10_2_ = sVar19 * 0xa4;
  auVar29._12_2_ = sVar16 * 0xad;
  auVar29._14_2_ = sVar19 * 0xb6;
  uVar15 = 0xfefdfefe;
  do {
    uVar15 = uVar15 + 0x2020202;
    auVar32._4_4_ = uVar15;
    auVar32._0_4_ = uVar15;
    auVar32._8_4_ = uVar15;
    auVar32._12_4_ = uVar15;
    auVar33 = pshufb(auVar48,auVar32);
    auVar32 = pshufb(auVar29,auVar32);
    uVar30 = auVar33._0_2_ * uVar20 + auVar32._0_2_ + 0x80;
    uVar34 = auVar33._2_2_ * sVar21 + auVar32._2_2_ + 0x80;
    uVar36 = auVar33._4_2_ * sVar22 + auVar32._4_2_ + 0x80;
    uVar38 = auVar33._6_2_ * sVar23 + auVar32._6_2_ + 0x80;
    uVar40 = auVar33._8_2_ * sVar24 + auVar32._8_2_ + 0x80;
    uVar42 = auVar33._10_2_ * sVar25 + auVar32._10_2_ + 0x80;
    uVar44 = auVar33._12_2_ * sVar26 + auVar32._12_2_ + 0x80;
    uVar46 = auVar33._14_2_ * uVar8 + auVar32._14_2_ + 0x80;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar37 = uVar36 >> 8;
    uVar39 = uVar38 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47),
                  CONCAT16((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45),
                           CONCAT15((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                                    (0xff < uVar43),
                                    CONCAT14((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8)
                                             - (0xff < uVar41),
                                             CONCAT13((uVar39 != 0) * (uVar39 < 0x100) *
                                                      (char)(uVar38 >> 8) - (0xff < uVar39),
                                                      CONCAT12((uVar37 != 0) * (uVar37 < 0x100) *
                                                               (char)(uVar36 >> 8) - (0xff < uVar37)
                                                               ,CONCAT11((uVar35 != 0) *
                                                                         (uVar35 < 0x100) *
                                                                         (char)(uVar34 >> 8) -
                                                                         (0xff < uVar35),
                                                                         (uVar31 != 0) *
                                                                         (uVar31 < 0x100) *
                                                                         (char)(uVar30 >> 8) -
                                                                         (0xff < uVar31))))))));
    auVar33 = _DAT_005158e0;
    dst = dst + stride;
  } while (uVar15 < 0xd0c0d0d);
  uVar15 = 0xfefdfefe;
  do {
    uVar15 = uVar15 + 0x2020202;
    auVar28._4_4_ = uVar15;
    auVar28._0_4_ = uVar15;
    auVar28._8_4_ = uVar15;
    auVar28._12_4_ = uVar15;
    auVar29 = pshufb(auVar33,auVar28);
    auVar48 = pshufb(auVar17,auVar28);
    uVar30 = auVar29._0_2_ * uVar20 + auVar48._0_2_ + 0x80;
    uVar34 = auVar29._2_2_ * sVar21 + auVar48._2_2_ + 0x80;
    uVar36 = auVar29._4_2_ * sVar22 + auVar48._4_2_ + 0x80;
    uVar38 = auVar29._6_2_ * sVar23 + auVar48._6_2_ + 0x80;
    uVar40 = auVar29._8_2_ * sVar24 + auVar48._8_2_ + 0x80;
    uVar42 = auVar29._10_2_ * sVar25 + auVar48._10_2_ + 0x80;
    uVar44 = auVar29._12_2_ * sVar26 + auVar48._12_2_ + 0x80;
    uVar46 = auVar29._14_2_ * uVar8 + auVar48._14_2_ + 0x80;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar37 = uVar36 >> 8;
    uVar39 = uVar38 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47),
                  CONCAT16((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45),
                           CONCAT15((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                                    (0xff < uVar43),
                                    CONCAT14((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8)
                                             - (0xff < uVar41),
                                             CONCAT13((uVar39 != 0) * (uVar39 < 0x100) *
                                                      (char)(uVar38 >> 8) - (0xff < uVar39),
                                                      CONCAT12((uVar37 != 0) * (uVar37 < 0x100) *
                                                               (char)(uVar36 >> 8) - (0xff < uVar37)
                                                               ,CONCAT11((uVar35 != 0) *
                                                                         (uVar35 < 0x100) *
                                                                         (char)(uVar34 >> 8) -
                                                                         (0xff < uVar35),
                                                                         (uVar31 != 0) *
                                                                         (uVar31 < 0x100) *
                                                                         (char)(uVar30 >> 8) -
                                                                         (0xff < uVar31))))))));
    auVar29 = _DAT_00515900;
    dst = dst + stride;
  } while (uVar15 < 0xd0c0d0d);
  auVar18._0_2_ = sVar16 * 0xeb;
  auVar18._2_2_ = sVar19 * 0xef;
  auVar18._4_2_ = sVar16 * 0xf2;
  auVar18._6_2_ = sVar19 * 0xf4;
  auVar18._8_2_ = sVar16 * 0xf6;
  auVar18._10_2_ = sVar19 * 0xf7;
  auVar18._12_2_ = sVar16 * 0xf8;
  auVar18._14_2_ = sVar19 * 0xf8;
  uVar15 = 0xfefdfefe;
  do {
    uVar15 = uVar15 + 0x2020202;
    auVar27._4_4_ = uVar15;
    auVar27._0_4_ = uVar15;
    auVar27._8_4_ = uVar15;
    auVar27._12_4_ = uVar15;
    auVar17 = pshufb(auVar29,auVar27);
    auVar33 = pshufb(auVar18,auVar27);
    uVar30 = auVar17._0_2_ * uVar20 + auVar33._0_2_ + 0x80;
    uVar34 = auVar17._2_2_ * sVar21 + auVar33._2_2_ + 0x80;
    uVar36 = auVar17._4_2_ * sVar22 + auVar33._4_2_ + 0x80;
    uVar38 = auVar17._6_2_ * sVar23 + auVar33._6_2_ + 0x80;
    uVar40 = auVar17._8_2_ * sVar24 + auVar33._8_2_ + 0x80;
    uVar42 = auVar17._10_2_ * sVar25 + auVar33._10_2_ + 0x80;
    uVar44 = auVar17._12_2_ * sVar26 + auVar33._12_2_ + 0x80;
    uVar46 = auVar17._14_2_ * uVar8 + auVar33._14_2_ + 0x80;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar37 = uVar36 >> 8;
    uVar39 = uVar38 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47),
                  CONCAT16((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45),
                           CONCAT15((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                                    (0xff < uVar43),
                                    CONCAT14((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8)
                                             - (0xff < uVar41),
                                             CONCAT13((uVar39 != 0) * (uVar39 < 0x100) *
                                                      (char)(uVar38 >> 8) - (0xff < uVar39),
                                                      CONCAT12((uVar37 != 0) * (uVar37 < 0x100) *
                                                               (char)(uVar36 >> 8) - (0xff < uVar37)
                                                               ,CONCAT11((uVar35 != 0) *
                                                                         (uVar35 < 0x100) *
                                                                         (char)(uVar34 >> 8) -
                                                                         (0xff < uVar35),
                                                                         (uVar31 != 0) *
                                                                         (uVar31 < 0x100) *
                                                                         (char)(uVar30 >> 8) -
                                                                         (0xff < uVar31))))))));
    dst = dst + stride;
  } while (uVar15 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_v_predictor_8x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[31]);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = _mm_unpackhi_epi8(weights_lo, zero);
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = _mm_unpackhi_epi8(weights_hi, zero);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i scaled_bottom_left3 =
      _mm_mullo_epi16(inverted_weights3, bottom_left);
  const __m128i scaled_bottom_left4 =
      _mm_mullo_epi16(inverted_weights4, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  const __m128i top = cvtepu8_epi16(LoadLo8(top_row));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights3, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left3, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights4, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left4, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
}